

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmfilelockmgr.cpp
# Opt level: O0

PAL_ERROR FILEAddNewLockedRgn(SHMFILELOCKS *fileLocks,PVOID pvControllerInstance,
                             SHMFILELOCKRGNS *insertAfter,UINT64 lockRgnStart,UINT64 nbBytesToLock,
                             LOCK_TYPE lockType)

{
  DWORD DVar1;
  SHMPTR shmptr;
  bool bVar2;
  SHMPTR shmNewLockRgn;
  SHMFILELOCKRGNS *lockRgnPtr;
  SHMFILELOCKRGNS *newLockRgn;
  PAL_ERROR palError;
  LOCK_TYPE lockType_local;
  UINT64 nbBytesToLock_local;
  UINT64 lockRgnStart_local;
  SHMFILELOCKRGNS *insertAfter_local;
  PVOID pvControllerInstance_local;
  SHMFILELOCKS *fileLocks_local;
  
  newLockRgn._0_4_ = 0;
  if ((fileLocks == (SHMFILELOCKS *)0x0) || (pvControllerInstance == (PVOID)0x0)) {
    fprintf(_stderr,"] %s %s:%d","FILEAddNewLockedRgn",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
            ,0x330);
    fprintf(_stderr,"Invalid Null parameter.\n");
    return 0;
  }
  SHMLock();
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  shmptr = SHMalloc(0x30);
  if (shmptr == 0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    newLockRgn._0_4_ = 8;
  }
  else {
    if (shmptr == 0) {
      lockRgnPtr = (SHMFILELOCKRGNS *)0x0;
      bVar2 = true;
    }
    else {
      lockRgnPtr = (SHMFILELOCKRGNS *)SHMPtrToPtr(shmptr);
      bVar2 = lockRgnPtr != (SHMFILELOCKRGNS *)0x0;
    }
    if (bVar2) {
      DVar1 = GetCurrentProcessId();
      lockRgnPtr->processId = DVar1;
      lockRgnPtr->pvControllerInstance = pvControllerInstance;
      lockRgnPtr->lockRgnStart = lockRgnStart;
      lockRgnPtr->nbBytesLocked = nbBytesToLock;
      lockRgnPtr->lockType = lockType;
      lockRgnStart_local = (UINT64)insertAfter;
      if (insertAfter == (SHMFILELOCKRGNS *)0x0) {
        if (fileLocks->fileLockedRgns == 0) {
          shmNewLockRgn = 0;
          bVar2 = true;
        }
        else {
          shmNewLockRgn = (SHMPTR)SHMPtrToPtr(fileLocks->fileLockedRgns);
          bVar2 = (LPVOID)shmNewLockRgn != (LPVOID)0x0;
        }
        if (!bVar2) {
          fprintf(_stderr,"] %s %s:%d","FILEAddNewLockedRgn",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
                  ,0x35d);
          fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
          newLockRgn._0_4_ = 0x54f;
          goto LAB_001488fb;
        }
      }
      else {
        if (insertAfter->next == 0) {
          shmNewLockRgn = 0;
          bVar2 = true;
        }
        else {
          shmNewLockRgn = (SHMPTR)SHMPtrToPtr(insertAfter->next);
          bVar2 = (LPVOID)shmNewLockRgn != (LPVOID)0x0;
        }
        if (!bVar2) {
          fprintf(_stderr,"] %s %s:%d","FILEAddNewLockedRgn",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
                  ,0x354);
          fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
          newLockRgn._0_4_ = 0x54f;
          goto LAB_001488fb;
        }
      }
      do {
        if (((shmNewLockRgn == 0) || (*(UINT64 *)(shmNewLockRgn + 0x10) != lockRgnPtr->lockRgnStart)
            ) || (lockRgnPtr->nbBytesLocked <= *(ulong *)(shmNewLockRgn + 0x18))) {
          if (lockRgnStart_local == 0) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            lockRgnPtr->next = fileLocks->fileLockedRgns;
            fileLocks->fileLockedRgns = shmptr;
          }
          else {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            lockRgnPtr->next = *(SHMPTR *)(lockRgnStart_local + 0x28);
            *(SHMPTR *)(lockRgnStart_local + 0x28) = shmptr;
          }
          goto LAB_001488fb;
        }
        lockRgnStart_local = shmNewLockRgn;
        if (*(long *)(shmNewLockRgn + 0x28) == 0) {
          shmNewLockRgn = 0;
          bVar2 = true;
        }
        else {
          shmNewLockRgn = (SHMPTR)SHMPtrToPtr(*(SHMPTR *)(shmNewLockRgn + 0x28));
          bVar2 = (LPVOID)shmNewLockRgn != (LPVOID)0x0;
        }
      } while (bVar2);
      fprintf(_stderr,"] %s %s:%d","FILEAddNewLockedRgn",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
              ,0x36b);
      fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
      newLockRgn._0_4_ = 0x54f;
    }
    else {
      fprintf(_stderr,"] %s %s:%d","FILEAddNewLockedRgn",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
              ,0x343);
      fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
      newLockRgn._0_4_ = 0x54f;
    }
  }
LAB_001488fb:
  if (((PAL_ERROR)newLockRgn != 0) && (shmptr != 0)) {
    SHMfree(shmptr);
  }
  SHMRelease();
  return (PAL_ERROR)newLockRgn;
}

Assistant:

PAL_ERROR
FILEAddNewLockedRgn(
    SHMFILELOCKS* fileLocks,
    PVOID pvControllerInstance, 
    SHMFILELOCKRGNS *insertAfter,
    UINT64 lockRgnStart, 
    UINT64 nbBytesToLock, 
    LOCK_TYPE lockType
    )
{
    PAL_ERROR palError = NO_ERROR;
    SHMFILELOCKRGNS *newLockRgn, *lockRgnPtr;
    SHMPTR shmNewLockRgn = SHMNULL;

    if ((fileLocks == NULL) || (pvControllerInstance == NULL))
    {
        ASSERT("Invalid Null parameter.\n");
        return FALSE;
    }

    SHMLock();
    
    /* Create a new entry for the new locked region */
    TRACE("Create a new entry for the new lock region (%I64u %I64u)\n", 
          lockRgnStart, nbBytesToLock);
    
    if ((shmNewLockRgn = SHMalloc(sizeof(SHMFILELOCKRGNS))) == SHMNULL)
    {
        ERROR("Can't allocate SHMFILELOCKRGNS structure\n");
        palError = ERROR_NOT_ENOUGH_MEMORY;
        goto EXIT;
    }

    if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, newLockRgn, shmNewLockRgn) == FALSE)
    {
        ASSERT("Unable to get pointer from shm pointer.\n");
        palError = ERROR_INTERNAL_ERROR;
        goto EXIT;
    }
    
    newLockRgn->processId = GetCurrentProcessId();
    newLockRgn->pvControllerInstance = pvControllerInstance;
    newLockRgn->lockRgnStart = lockRgnStart;
    newLockRgn->nbBytesLocked = nbBytesToLock;
    newLockRgn->lockType = lockType;
    
    /* All locked regions with the same offset should be sorted ascending */
    /* the sort is based on the length of the locked byte range */
    if (insertAfter != NULL)
    {
        if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, lockRgnPtr, insertAfter->next) == FALSE)
        {
            ASSERT("Unable to get pointer from shm pointer.\n");
            palError = ERROR_INTERNAL_ERROR;
            goto EXIT;
        }
    }
    else
    {
        if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, lockRgnPtr, fileLocks->fileLockedRgns) == FALSE)
        {
            ASSERT("Unable to get pointer from shm pointer.\n");
            palError = ERROR_INTERNAL_ERROR;
            goto EXIT;
        }
    }
    
    while(lockRgnPtr != NULL)
    {
        if ( (lockRgnPtr->lockRgnStart == newLockRgn->lockRgnStart) &&
             (newLockRgn->nbBytesLocked > lockRgnPtr->nbBytesLocked))
        {
            insertAfter = lockRgnPtr;
            if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, lockRgnPtr, lockRgnPtr->next) == FALSE)
            {
                ASSERT("Unable to get pointer from shm pointer.\n");
                palError = ERROR_INTERNAL_ERROR;
                goto EXIT;
            }
            continue;
        }

        break;
    }
    
    if (insertAfter != NULL)
    {       
        TRACE("Adding lock after the lock rgn (%I64d %I64d)\n", 
              insertAfter->lockRgnStart,insertAfter->nbBytesLocked);
        newLockRgn->next = insertAfter->next;
        insertAfter->next = shmNewLockRgn;
    }
    else
    {
        TRACE("adding lock into the head of the list\n");
        newLockRgn->next = fileLocks->fileLockedRgns;
        fileLocks->fileLockedRgns = shmNewLockRgn;
    }

EXIT:

    if (NO_ERROR != palError && SHMNULL != shmNewLockRgn)
    {
        SHMfree(shmNewLockRgn);
    }
   
    SHMRelease();
    
    return palError;
}